

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v6::internal::
basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
::
write_padded<fmt::v6::internal::basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>::padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>::int_writer<char,fmt::v6::basic_format_specs<char>>::dec_writer>>
          (basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
           *this,format_specs *specs,
          padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>::int_writer<char,_fmt::v6::basic_format_specs<char>_>::dec_writer>
          *f)

{
  char *pcVar1;
  ulong __n;
  padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>::int_writer<char,_fmt::v6::basic_format_specs<char>_>::dec_writer>
  *this_00;
  padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>::int_writer<char,_fmt::v6::basic_format_specs<char>_>::dec_writer>
  *in_RDX;
  int *in_RSI;
  char **in_RDI;
  size_t left_padding;
  size_t padding;
  char_type fill;
  checked_ptr<typename_buffer<char>::value_type> *it;
  size_t num_code_points;
  size_t size;
  uint width;
  size_t in_stack_ffffffffffffff88;
  padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>::int_writer<char,_fmt::v6::basic_format_specs<char>_>::dec_writer>
  *in_stack_ffffffffffffffa0;
  undefined7 in_stack_ffffffffffffffb0;
  char cVar2;
  checked_ptr<typename_buffer<char>::value_type> local_48;
  checked_ptr<typename_buffer<char>::value_type> *local_40;
  checked_ptr<typename_buffer<char>::value_type> local_38;
  basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
  *local_30;
  basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
  *local_28;
  type local_1c;
  padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>::int_writer<char,_fmt::v6::basic_format_specs<char>_>::dec_writer>
  *local_18;
  int *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_1c = to_unsigned<int>(*in_RSI);
  local_30 = (basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
              *)basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
                ::
                padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>::int_writer<char,_fmt::v6::basic_format_specs<char>_>::dec_writer>
                ::size(local_18);
  local_28 = local_30;
  if (local_1c != 0) {
    local_30 = (basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
                *)basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
                  ::
                  padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>::int_writer<char,_fmt::v6::basic_format_specs<char>_>::dec_writer>
                  ::width(local_18);
  }
  if (local_30 <
      (basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
       *)(ulong)local_1c) {
    local_48 = basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
               ::reserve(local_30,in_stack_ffffffffffffff88);
    local_40 = &local_48;
    pcVar1 = fill_t<char>::operator[]((fill_t<char> *)((long)local_10 + 10),0);
    cVar2 = *pcVar1;
    __n = (ulong)local_1c - (long)local_30;
    if ((*(byte *)((long)local_10 + 9) & 0xf) == 2) {
      pcVar1 = std::fill_n<char*,unsigned_long,char>
                         ((char *)CONCAT17(cVar2,in_stack_ffffffffffffffb0),__n,
                          (char *)in_stack_ffffffffffffffa0);
      *local_40 = pcVar1;
      padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>::int_writer<char,fmt::v6::basic_format_specs<char>>::dec_writer>
      ::operator()(in_stack_ffffffffffffffa0,in_RDI);
    }
    else if ((*(byte *)((long)local_10 + 9) & 0xf) == 3) {
      this_00 = (padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>::int_writer<char,_fmt::v6::basic_format_specs<char>_>::dec_writer>
                 *)(__n >> 1);
      pcVar1 = std::fill_n<char*,unsigned_long,char>
                         ((char *)CONCAT17(cVar2,in_stack_ffffffffffffffb0),__n,(char *)this_00);
      *local_40 = pcVar1;
      padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>::int_writer<char,fmt::v6::basic_format_specs<char>>::dec_writer>
      ::operator()(this_00,in_RDI);
      pcVar1 = std::fill_n<char*,unsigned_long,char>
                         ((char *)CONCAT17(cVar2,in_stack_ffffffffffffffb0),__n,(char *)this_00);
      *local_40 = pcVar1;
    }
    else {
      padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>::int_writer<char,fmt::v6::basic_format_specs<char>>::dec_writer>
      ::operator()(in_stack_ffffffffffffffa0,in_RDI);
      pcVar1 = std::fill_n<char*,unsigned_long,char>
                         ((char *)CONCAT17(cVar2,in_stack_ffffffffffffffb0),__n,
                          (char *)in_stack_ffffffffffffffa0);
      *local_40 = pcVar1;
    }
  }
  else {
    local_38 = basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
               ::reserve(local_30,(size_t)local_18);
    padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>::int_writer<char,fmt::v6::basic_format_specs<char>>::dec_writer>
    ::operator()(in_stack_ffffffffffffffa0,in_RDI);
  }
  return;
}

Assistant:

void write_padded(const format_specs& specs, F&& f) {
    // User-perceived width (in code points).
    unsigned width = to_unsigned(specs.width);
    size_t size = f.size();  // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points) return f(reserve(size));
    auto&& it = reserve(width + (size - num_code_points));
    char_type fill = specs.fill[0];
    std::size_t padding = width - num_code_points;
    if (specs.align == align::right) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (specs.align == align::center) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }